

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_7_dq_string_inner(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *stuff;
  PVIPNode *pPVar1;
  
  pPVar1 = (G->data).literal_str;
  stuff = PVIP_node_new_children1(&G->data,PVIP_NODE_STRINGIFY,G->val[-3]);
  pPVar1 = PVIP_node_append_string_node(&G->data,pPVar1,stuff);
  (G->data).literal_str = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_7_dq_string_inner(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define v G->val[-1]
#define k G->val[-2]
#define h G->val[-3]
#define e G->val[-4]
  yyprintf((stderr, "do yy_7_dq_string_inner"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {APPEND_N(CHILDREN1(PVIP_NODE_STRINGIFY, h)); }\n"));
  APPEND_N(CHILDREN1(PVIP_NODE_STRINGIFY, h)); ;
#undef v
#undef k
#undef h
#undef e
}